

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tester.c
# Opt level: O3

void search_tests(char *name,test **matched,int *n)

{
  char *pcVar1;
  int iVar2;
  size_t sVar3;
  long lVar4;
  test *ptVar5;
  int iVar6;
  long lVar7;
  
  lVar7 = (long)test_count;
  if (lVar7 < 1) {
    iVar6 = 0;
  }
  else {
    iVar6 = 0;
    ptVar5 = tests;
    do {
      pcVar1 = ptVar5->suite;
      sVar3 = strlen(pcVar1);
      iVar2 = strncmp(name,pcVar1,sVar3);
      if (iVar2 == 0) {
LAB_001028b5:
        lVar4 = (long)iVar6;
        iVar6 = iVar6 + 1;
        matched[lVar4] = ptVar5;
      }
      else {
        pcVar1 = ptVar5->name;
        sVar3 = strlen(pcVar1);
        iVar2 = strncmp(name,pcVar1,sVar3);
        if (iVar2 == 0) goto LAB_001028b5;
      }
      ptVar5 = ptVar5 + 1;
      lVar7 = lVar7 + -1;
    } while (lVar7 != 0);
  }
  *n = iVar6;
  return;
}

Assistant:

void search_tests(const char *name, struct test **matched, int *n){
  int j = 0;
  for(int i=0; i<test_count; ++i){
    if(strncmp(name, tests[i].suite, strlen(tests[i].suite)) == 0
       || strncmp(name, tests[i].name, strlen(tests[i].name)) == 0)
      matched[j++] = &tests[i];
  }
  *n = j;
}